

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

FFSWriterRec
CreateWriterRec(SstStream Stream,void *Variable,char *Name,int Type,size_t ElemSize,size_t DimCount)

{
  int *piVar1;
  void *pvVar2;
  FFSWriterRec FieldP;
  char *pcVar3;
  FMFieldList *FieldP_00;
  int *CountP;
  SstStream Stream_00;
  FMFieldList *FieldP_01;
  int *CountP_00;
  int in_ECX;
  void *in_RSI;
  long in_RDI;
  long in_R9;
  char *SstName_1;
  char *ElemCountName;
  char *OffsetsName;
  char *CountName;
  char *ShapeName;
  char *ArrayDBCount;
  char *ArrayName;
  char *SstName;
  FFSWriterRec Rec;
  FFSWriterMarshalBase *Info;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  SstStream in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  FMFieldList *in_stack_ffffffffffffff90;
  SstStream in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffb8;
  
  if (*(long *)(in_RDI + 0x1c0) == 0) {
    InitMarshalData(in_stack_ffffffffffffff80);
  }
  piVar1 = *(int **)(in_RDI + 0x1c0);
  pvVar2 = realloc(*(void **)(piVar1 + 2),(long)(*piVar1 + 1) * 0x28);
  *(void **)(piVar1 + 2) = pvVar2;
  FieldP = (FFSWriterRec)(*(long *)(piVar1 + 2) + (long)*piVar1 * 0x28);
  FieldP->Key = in_RSI;
  FieldP->FieldID = *piVar1;
  FieldP->DimCount = (int)in_R9;
  FieldP->Type = in_ECX;
  if (in_R9 == 0) {
    pcVar3 = ConcatName((char *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    AddField(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    free(pcVar3);
    RecalcMarshalStorageSize(in_stack_ffffffffffffffa0);
    FieldP->MetaOffset =
         (long)*(int *)(*(long *)(piVar1 + 8) + (long)(piVar1[6] + -1) * 0x18 + 0x14);
    FieldP->DataOffset = 0xffffffffffffffff;
    piVar1[10] = 0;
    piVar1[0xb] = 0;
  }
  else {
    FieldP_00 = (FMFieldList *)
                BuildArrayDimsName((char *)in_stack_ffffffffffffff90,
                                   (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                                   (int)in_stack_ffffffffffffff88);
    CountP = (int *)BuildArrayDBCountName
                              ((char *)in_stack_ffffffffffffff90,
                               (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                               (int)in_stack_ffffffffffffff88);
    AddField(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    free(FieldP_00);
    FieldP->MetaOffset =
         (long)*(int *)(*(long *)(piVar1 + 8) + (long)(piVar1[6] + -1) * 0x18 + 0x14);
    Stream_00 = (SstStream)
                ConcatName((char *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    pcVar3 = ConcatName((char *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    FieldP_01 = (FMFieldList *)
                ConcatName((char *)in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
    AddField(FieldP_01,in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    AddFixedArrayField(FieldP_00,CountP,(char *)Stream_00,(int)((ulong)pcVar3 >> 0x20),(int)pcVar3,
                       (int)((ulong)FieldP_01 >> 0x20));
    AddVarArrayField((FMFieldList *)FieldP,in_stack_ffffffffffffffb8,(char *)FieldP_00,
                     (int)((ulong)CountP >> 0x20),(int)CountP,(char *)Stream_00);
    AddVarArrayField((FMFieldList *)FieldP,in_stack_ffffffffffffffb8,(char *)FieldP_00,
                     (int)((ulong)CountP >> 0x20),(int)CountP,(char *)Stream_00);
    free(CountP);
    free(Stream_00);
    free(pcVar3);
    free(FieldP_01);
    RecalcMarshalStorageSize(Stream_00);
    CountP_00 = (int *)ConcatName((char *)FieldP_01,(char *)in_stack_ffffffffffffff88);
    AddField(FieldP_01,CountP_00,(char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             in_stack_ffffffffffffff78);
    FieldP->DataOffset =
         (long)*(int *)(*(long *)(piVar1 + 0xe) + (long)(piVar1[0xc] + -1) * 0x18 + 0x14);
    pcVar3 = ConcatName((char *)FieldP_01,(char *)CountP_00);
    AddVarArrayField((FMFieldList *)FieldP,in_stack_ffffffffffffffb8,(char *)FieldP_00,
                     (int)((ulong)CountP >> 0x20),(int)CountP,(char *)Stream_00);
    free(pcVar3);
    free(CountP_00);
    RecalcMarshalStorageSize(Stream_00);
    piVar1[10] = 0;
    piVar1[0xb] = 0;
    piVar1[0x10] = 0;
    piVar1[0x11] = 0;
  }
  *piVar1 = *piVar1 + 1;
  return FieldP;
}

Assistant:

static FFSWriterRec CreateWriterRec(SstStream Stream, void *Variable, const char *Name, int Type,
                                    size_t ElemSize, size_t DimCount)
{
    if (!Stream->WriterMarshalData)
    {
        InitMarshalData(Stream);
    }
    struct FFSWriterMarshalBase *Info = (struct FFSWriterMarshalBase *)Stream->WriterMarshalData;
    Info->RecList = realloc(Info->RecList, (Info->RecCount + 1) * sizeof(Info->RecList[0]));
    FFSWriterRec Rec = &Info->RecList[Info->RecCount];
    Rec->Key = Variable;
    Rec->FieldID = Info->RecCount;
    Rec->DimCount = (int)DimCount;
    Rec->Type = Type;
    if (DimCount == 0)
    {
        // simple field, only add base value FMField to metadata
        char *SstName = ConcatName(Name, "");
        AddField(&Info->MetaFields, &Info->MetaFieldCount, SstName, Type, (int)ElemSize);
        free(SstName);
        RecalcMarshalStorageSize(Stream);
        Rec->MetaOffset = Info->MetaFields[Info->MetaFieldCount - 1].field_offset;
        Rec->DataOffset = (size_t)-1;
        // Changing the formats renders these invalid
        Info->MetaFormat = NULL;
    }
    else
    {
        // Array field.  To Metadata, add FMFields for DimCount, Shape, Count
        // and Offsets matching _MetaArrayRec
        char *ArrayName = BuildArrayDimsName(Name, Type, (int)ElemSize);
        char *ArrayDBCount = BuildArrayDBCountName(Name, Type, (int)ElemSize);
        AddField(&Info->MetaFields, &Info->MetaFieldCount, ArrayName, Int64, sizeof(size_t));
        free(ArrayName);
        Rec->MetaOffset = Info->MetaFields[Info->MetaFieldCount - 1].field_offset;
        char *ShapeName = ConcatName(Name, "Shape");
        char *CountName = ConcatName(Name, "Count");
        char *OffsetsName = ConcatName(Name, "Offsets");
        AddField(&Info->MetaFields, &Info->MetaFieldCount, ArrayDBCount, Int64, sizeof(size_t));
        AddFixedArrayField(&Info->MetaFields, &Info->MetaFieldCount, ShapeName, Int64,
                           sizeof(size_t), (int)DimCount);
        AddVarArrayField(&Info->MetaFields, &Info->MetaFieldCount, CountName, Int64, sizeof(size_t),
                         ArrayDBCount);
        AddVarArrayField(&Info->MetaFields, &Info->MetaFieldCount, OffsetsName, Int64,
                         sizeof(size_t), ArrayDBCount);
        free(ArrayDBCount);
        free(ShapeName);
        free(CountName);
        free(OffsetsName);
        RecalcMarshalStorageSize(Stream);

        if ((Stream->ConfigParams->CompressionMethod == SstCompressZFP) &&
            ZFPcompressionPossible(Type, DimCount))
        {
            Type = Int8;
            ElemSize = 1;
        }
        // To Data, add FMFields for ElemCount and Array matching _ArrayRec
        char *ElemCountName = ConcatName(Name, "ElemCount");
        AddField(&Info->DataFields, &Info->DataFieldCount, ElemCountName, Int64, sizeof(size_t));
        Rec->DataOffset = Info->DataFields[Info->DataFieldCount - 1].field_offset;
        char *SstName = ConcatName(Name, "");
        AddVarArrayField(&Info->DataFields, &Info->DataFieldCount, SstName, Type, (int)ElemSize,
                         ElemCountName);
        free(SstName);
        free(ElemCountName);
        RecalcMarshalStorageSize(Stream);
        // Changing the formats renders these invalid
        Info->MetaFormat = NULL;
        Info->DataFormat = NULL;
    }
    Info->RecCount++;
    return Rec;
}